

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall
VertexClustering::initClusters
          (VertexClustering *this,vector<VCEdge,_std::allocator<VCEdge>_> *edges)

{
  _Rb_tree_header *__last;
  pointer ppVVar1;
  int iVar2;
  iterator iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces_vec;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> faces;
  allocator_type local_79;
  _Vector_base<VCFace_*,_std::allocator<VCFace_*>_> local_78;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  local_60;
  
  __last = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar6 = (this->opts).numCluster;
  iVar5 = (int)((ulong)((long)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4);
  uVar4 = (ulong)iVar5;
  if (uVar4 < uVar6) {
    (this->opts).numCluster = uVar4;
    uVar6 = uVar4;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  while (local_60._M_impl.super__Rb_tree_header._M_node_count < uVar6) {
    do {
      iVar2 = rand();
      local_78._M_impl.super__Vector_impl_data._M_start =
           (pointer)(edges->super__Vector_base<VCEdge,_std::allocator<VCEdge>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar2 % iVar5].f1;
      iVar3 = std::
              _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
              ::find(&local_60,(key_type *)&local_78);
    } while ((_Rb_tree_header *)iVar3._M_node != __last);
    std::
    _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>::
    _M_insert_unique<VCFace*const&>
              ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                *)&local_60,(VCFace **)&local_78);
    uVar6 = (this->opts).numCluster;
  }
  std::vector<VCFace*,std::allocator<VCFace*>>::vector<std::_Rb_tree_const_iterator<VCFace*>,void>
            ((vector<VCFace*,std::allocator<VCFace*>> *)&local_78,
             (_Rb_tree_const_iterator<VCFace_*>)
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<VCFace_*>)__last,&local_79);
  for (uVar6 = 0; uVar6 < (this->opts).numCluster; uVar6 = uVar6 + 1) {
    ppVVar1 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    VCCluster::giveItem(*ppVVar1,*(VCFace **)
                                  ((long)&((Vector3d *)
                                          ((long)local_78._M_impl.super__Vector_impl_data._M_start +
                                          0x10))->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                  + uVar6 * 8 + -0x10),ppVVar1[uVar6 + 1]);
  }
  std::_Vector_base<VCFace_*,_std::allocator<VCFace_*>_>::~_Vector_base(&local_78);
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VertexClustering::initClusters(vector<VCEdge>& edges) {
	int n = edges.size();
	set<VCFace*> faces;
	if (opts.numCluster > n)
		opts.numCluster = n;
	while (faces.size() < opts.numCluster) {
		while (true) {
			int r = rand() % n;
			VCFace* f = edges[r].f1;
			if (faces.find(f) == faces.end()) {
				faces.insert(f);
				break;
			}
		}
	}
	vector<VCFace*> faces_vec(faces.begin(), faces.end());
	for (int i = 0; i < opts.numCluster; ++i) {
		clusters[0]->giveItem(faces_vec[i], clusters[i + 1]);
	}
	
}